

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_helpers.hpp
# Opt level: O2

void sdglib::write_flat_vector<NodePosition>
               (ofstream *ofs,vector<NodePosition,_std::allocator<NodePosition>_> *v)

{
  uint64_t count;
  
  count = (long)(v->super__Vector_base<NodePosition,_std::allocator<NodePosition>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(v->super__Vector_base<NodePosition,_std::allocator<NodePosition>_>)._M_impl.
                super__Vector_impl_data._M_start >> 4;
  std::ostream::write((char *)ofs,(long)&count);
  if (count != 0) {
    std::ostream::write((char *)ofs,
                        (long)(v->super__Vector_base<NodePosition,_std::allocator<NodePosition>_>).
                              _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

inline void write_flat_vector(std::ofstream &ofs, const std::vector<T> &v) {
        uint64_t count=v.size();
        ofs.write(reinterpret_cast<const char *>(&count),sizeof(count));
        if (count > 0) ofs.write(reinterpret_cast<const char *>(v.data()),sizeof(T)*count);
    }